

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateDependentInlineMethods
          (MessageGenerator *this,Printer *printer)

{
  FieldGenerator *pFVar1;
  Descriptor *pDVar2;
  long lVar3;
  int i;
  long lVar4;
  
  pDVar2 = this->descriptor_;
  if (*(char *)(*(long *)(pDVar2 + 0x20) + 0x6b) != '\0') {
    return;
  }
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(pDVar2 + 0x2c); lVar4 = lVar4 + 1) {
    if (*(char *)(*(long *)(*(long *)(pDVar2 + 0x30) + 0x80 + lVar3) + 0x6f) == '\x01') {
      pFVar1 = FieldGeneratorMap::get
                         (&this->field_generators_,
                          (FieldDescriptor *)(*(long *)(pDVar2 + 0x30) + lVar3));
      (*pFVar1->_vptr_FieldGenerator[6])(pFVar1,printer);
      pDVar2 = this->descriptor_;
    }
    lVar3 = lVar3 + 0xa8;
  }
  GenerateDependentFieldAccessorDefinitions(this,printer);
  return;
}

Assistant:

void MessageGenerator::
GenerateDependentInlineMethods(io::Printer* printer) {
  if (IsMapEntryMessage(descriptor_)) return;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (descriptor_->field(i)->options().weak()) {
      field_generators_.get(descriptor_->field(i))
          .GenerateDependentInlineAccessorDefinitions(printer);
    }
  }
  GenerateDependentFieldAccessorDefinitions(printer);
}